

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O1

bool __thiscall PhyloTree::removeSplit(PhyloTree *this,Bipartition *e)

{
  bool bVar1;
  bool bVar2;
  pointer pPVar3;
  ulong uVar4;
  long lVar5;
  
  pPVar3 = (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
      super__Vector_impl_data._M_finish == pPVar3) {
    bVar2 = false;
  }
  else {
    uVar4 = 1;
    lVar5 = 0;
    bVar2 = false;
    do {
      bVar1 = PhyloTreeEdge::sameBipartition
                        ((PhyloTreeEdge *)
                         ((long)&(pPVar3->super_Bipartition)._vptr_Bipartition + lVar5),e);
      if (bVar1) {
        std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::_M_erase
                  (&this->edges,
                   (PhyloTreeEdge *)
                   ((long)&(((this->edges).
                             super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                             _M_impl.super__Vector_impl_data._M_start)->super_Bipartition).
                           _vptr_Bipartition + lVar5));
        bVar2 = true;
      }
      pPVar3 = (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->edges).
                         super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
                 -0x71c71c71c71c71c7) <= uVar4) {
        return bVar2;
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x48;
    } while (!bVar2);
  }
  return bVar2;
}

Assistant:

bool PhyloTree::removeSplit(const Bipartition &e) {
    bool removed = false;
    size_t i = 0;
    while (i < edges.size() && !removed) {
        if (edges[i].sameBipartition(e)) {
            Tools::vector_remove_element_at_index(edges, i);
            removed = true;
        }
        i++;
    }
    return removed;
}